

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  _func_void_void_ptr *xDel;
  uint in_EDX;
  sqlite3_context *in_RSI;
  sqlite3_context *in_RDI;
  Fts3auxCursor *p;
  int n;
  undefined4 in_stack_ffffffffffffffe8;
  
  xDel = (_func_void_void_ptr *)(ulong)in_EDX;
  n = (int)((ulong)in_RDI >> 0x20);
  switch(xDel) {
  case (_func_void_void_ptr *)0x0:
    sqlite3_result_text(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n,xDel);
    break;
  case (_func_void_void_ptr *)0x1:
    if (*(int *)&in_RDI[3].pFunc == 0) {
      sqlite3_result_text(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),n,xDel);
    }
    else {
      sqlite3_result_int(in_RDI,0);
    }
    break;
  case (_func_void_void_ptr *)0x2:
    sqlite3_result_int64(in_RDI,(i64)xDel);
    break;
  case (_func_void_void_ptr *)0x3:
    sqlite3_result_int64(in_RDI,(i64)xDel);
    break;
  default:
    sqlite3_result_int(in_RDI,0);
  }
  return 0;
}

Assistant:

static int fts3auxColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts3auxCursor *p = (Fts3auxCursor *)pCursor;

  assert( p->isEof==0 );
  switch( iCol ){
    case 0: /* term */
      sqlite3_result_text(pCtx, p->csr.zTerm, p->csr.nTerm, SQLITE_TRANSIENT);
      break;

    case 1: /* col */
      if( p->iCol ){
        sqlite3_result_int(pCtx, p->iCol-1);
      }else{
        sqlite3_result_text(pCtx, "*", -1, SQLITE_STATIC);
      }
      break;

    case 2: /* documents */
      sqlite3_result_int64(pCtx, p->aStat[p->iCol].nDoc);
      break;

    case 3: /* occurrences */
      sqlite3_result_int64(pCtx, p->aStat[p->iCol].nOcc);
      break;

    default: /* languageid */
      assert( iCol==4 );
      sqlite3_result_int(pCtx, p->iLangid);
      break;
  }

  return SQLITE_OK;
}